

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::ConstantPropagationCase::generateProgramData
          (ProgramData *__return_storage_ptr__,ConstantPropagationCase *this,bool optimized)

{
  CaseShaderType CVar1;
  CaseType CVar2;
  byte bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  ulong *puVar8;
  long *plVar9;
  size_type *psVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  byte bVar15;
  int iVar16;
  string constMaybe;
  string precision;
  string statements;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  ulong *local_568;
  long local_560;
  ulong local_558;
  long lStack_550;
  long *local_548;
  undefined8 local_540;
  long local_538;
  undefined8 uStack_530;
  long *local_528;
  undefined8 local_520;
  long local_518;
  undefined8 uStack_510;
  ulong *local_508;
  long local_500;
  ulong local_4f8;
  long lStack_4f0;
  string local_4e8;
  long *local_4c8;
  undefined8 local_4c0;
  long local_4b8;
  undefined8 uStack_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string local_488;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  string local_448;
  long *local_428;
  long local_420;
  long local_418;
  long lStack_410;
  long *local_408;
  long local_400;
  long local_3f8;
  long lStack_3f0;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  long *local_3c8;
  long local_3c0;
  long local_3b8;
  long lStack_3b0;
  long *local_3a8;
  long local_3a0;
  long local_398;
  long lStack_390;
  long *local_388;
  long local_380;
  long local_378;
  long lStack_370;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  ulong *local_1e8;
  long local_1e0;
  ulong local_1d8 [2];
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
  if (CASESHADERTYPE_FRAGMENT < CVar1) {
    std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_006d6775:
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    uVar7 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,
                      CONCAT26(local_588.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_588.field_2._M_local_buf[5],
                                        CONCAT14(local_588.field_2._M_local_buf[4],
                                                 local_588.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar7);
  }
  local_588.field_2._M_local_buf[4] = 'p';
  local_588.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_588._M_string_length = 5;
  local_588.field_2._M_local_buf[5] = '\0';
  CVar2 = this->m_caseType;
  if (CVar2 == CASETYPE_STRUCT) {
    pcVar12 = "";
    if (this->m_useConstantExpressionsOnly != false) {
      pcVar12 = "const ";
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    pcVar11 = pcVar12 + 6;
    if (this->m_useConstantExpressionsOnly == false) {
      pcVar11 = pcVar12;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,pcVar12,pcVar11);
    iVar16 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar16 = 0xc;
    }
    if (optimized) {
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)local_1a8);
      _Var14._M_p = local_1a8[0]._M_dataplus._M_p;
      local_4e8.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_4e8._M_dataplus._M_p = (pointer)paVar4;
      memcpy(paVar4,
             "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
             ,0xa5);
      local_4e8._M_string_length = (size_type)_Var14._M_p;
      paVar4->_M_local_buf[(long)_Var14._M_p] = '\0';
    }
    else {
      std::operator+(&local_2e8,"\tstruct S\n\t{\n\t\t",&local_588);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2e8);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_308.field_2._M_allocated_capacity = *puVar8;
        local_308.field_2._8_8_ = plVar5[3];
      }
      else {
        local_308.field_2._M_allocated_capacity = *puVar8;
        local_308._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_308._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_308,(ulong)local_588._M_dataplus._M_p);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_288.field_2._M_allocated_capacity = *puVar8;
        local_288.field_2._8_8_ = plVar5[3];
      }
      else {
        local_288.field_2._M_allocated_capacity = *puVar8;
        local_288._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_288._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_288);
      local_468 = &local_458;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_458 = *plVar5;
        lStack_450 = puVar6[3];
      }
      else {
        local_458 = *plVar5;
        local_468 = (long *)*puVar6;
      }
      local_460 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_468,(ulong)local_588._M_dataplus._M_p)
      ;
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_448.field_2._M_allocated_capacity = *psVar10;
        local_448.field_2._8_8_ = puVar6[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = *psVar10;
        local_448._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_448._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_448);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      puVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_488.field_2._M_allocated_capacity = *puVar8;
        local_488.field_2._8_8_ = puVar6[3];
      }
      else {
        local_488.field_2._M_allocated_capacity = *puVar8;
        local_488._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_488._M_string_length = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_488,(ulong)local_588._M_dataplus._M_p)
      ;
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      psVar10 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_4a8.field_2._M_allocated_capacity = *psVar10;
        local_4a8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4a8.field_2._M_allocated_capacity = *psVar10;
        local_4a8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4a8._M_string_length = puVar6[1];
      *puVar6 = psVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a8);
      local_4c8 = &local_4b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_4b8 = *plVar5;
        uStack_4b0 = puVar6[3];
      }
      else {
        local_4b8 = *plVar5;
        local_4c8 = (long *)*puVar6;
      }
      local_4c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_428 = &local_418;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_418 = *plVar5;
        lStack_410 = puVar6[3];
      }
      else {
        local_418 = *plVar5;
        local_428 = (long *)*puVar6;
      }
      local_420 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
      local_408 = &local_3f8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3f8 = *plVar5;
        lStack_3f0 = puVar6[3];
      }
      else {
        local_3f8 = *plVar5;
        local_408 = (long *)*puVar6;
      }
      local_400 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_3e8 = &local_3d8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3d8 = *plVar5;
        lStack_3d0 = puVar6[3];
      }
      else {
        local_3d8 = *plVar5;
        local_3e8 = (long *)*puVar6;
      }
      local_3e0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_588._M_dataplus._M_p)
      ;
      local_3c8 = &local_3b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3b8 = *plVar5;
        lStack_3b0 = puVar6[3];
      }
      else {
        local_3b8 = *plVar5;
        local_3c8 = (long *)*puVar6;
      }
      local_3c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
      local_3a8 = &local_398;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_398 = *plVar5;
        lStack_390 = puVar6[3];
      }
      else {
        local_398 = *plVar5;
        local_3a8 = (long *)*puVar6;
      }
      local_3a0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_388 = &local_378;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_378 = *plVar5;
        lStack_370 = puVar6[3];
      }
      else {
        local_378 = *plVar5;
        local_388 = (long *)*puVar6;
      }
      local_380 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_588._M_dataplus._M_p)
      ;
      local_368 = &local_358;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_358 = *plVar5;
        lStack_350 = puVar6[3];
      }
      else {
        local_358 = *plVar5;
        local_368 = (long *)*puVar6;
      }
      local_360 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_558 = *puVar8;
        lStack_550 = puVar6[3];
        local_568 = &local_558;
      }
      else {
        local_558 = *puVar8;
        local_568 = (ulong *)*puVar6;
      }
      local_560 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::operator+(&local_248,"\t",&local_5a8);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_248,(ulong)local_588._M_dataplus._M_p);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_228.field_2._M_allocated_capacity = *puVar8;
        local_228.field_2._8_8_ = plVar5[3];
      }
      else {
        local_228.field_2._M_allocated_capacity = *puVar8;
        local_228._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_228._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_228);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208.field_2._8_8_ = plVar5[3];
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar10;
        local_208._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_208._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      repeatIndexedTemplate(&local_268,&local_208,iVar16,&local_1c8,1);
      uVar13 = 0xf;
      if (local_568 != &local_558) {
        uVar13 = local_558;
      }
      if (uVar13 < local_268._M_string_length + local_560) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          uVar7 = local_268.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_268._M_string_length + local_560) goto LAB_006d5090;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_568);
      }
      else {
LAB_006d5090:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_568,(ulong)local_268._M_dataplus._M_p);
      }
      local_548 = &local_538;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_538 = *plVar5;
        uStack_530 = puVar6[3];
      }
      else {
        local_538 = *plVar5;
        local_548 = (long *)*puVar6;
      }
      local_540 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
      local_348 = &local_338;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_338 = *plVar5;
        lStack_330 = puVar6[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar6;
      }
      local_340 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_328 = &local_318;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_318 = *plVar5;
        lStack_310 = puVar6[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar6;
      }
      local_320 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_588._M_dataplus._M_p)
      ;
      local_2c8 = &local_2b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_2b8 = *plVar5;
        lStack_2b0 = puVar6[3];
      }
      else {
        local_2b8 = *plVar5;
        local_2c8 = (long *)*puVar6;
      }
      local_2c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_4f8 = *puVar8;
        lStack_4f0 = puVar6[3];
        local_508 = &local_4f8;
      }
      else {
        local_4f8 = *puVar8;
        local_508 = (ulong *)*puVar6;
      }
      local_500 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar16);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar13 = 0xf;
      if (local_508 != &local_4f8) {
        uVar13 = local_4f8;
      }
      if (uVar13 < (ulong)(local_1e0 + local_500)) {
        uVar13 = 0xf;
        if (local_1e8 != local_1d8) {
          uVar13 = local_1d8[0];
        }
        if (uVar13 < (ulong)(local_1e0 + local_500)) goto LAB_006d58a1;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_508);
      }
      else {
LAB_006d58a1:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_508,(ulong)local_1e8);
      }
      local_528 = &local_518;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_518 = *plVar5;
        uStack_510 = puVar6[3];
      }
      else {
        local_518 = *plVar5;
        local_528 = (long *)*puVar6;
      }
      local_520 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_528);
      local_2a8 = &local_298;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar5[3];
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar5;
      }
      local_2a0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      plVar5 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar5) {
        local_4e8.field_2._M_allocated_capacity = *plVar5;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *plVar5;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
    }
    if (optimized) goto LAB_006d66aa;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,local_518 + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if (local_508 != &local_4f8) {
      operator_delete(local_508,local_4f8 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if (local_548 != &local_538) {
      operator_delete(local_548,local_538 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568,local_558 + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378 + 1);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,local_398 + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,local_3b8 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_2e8.field_2._M_allocated_capacity;
    _Var14._M_p = local_2e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p == &local_2e8.field_2) goto LAB_006d66aa;
  }
  else {
    if (CVar2 == CASETYPE_ARRAY) {
      bVar15 = this->m_useConstantExpressionsOnly;
      pcVar12 = "";
      if ((bool)bVar15 != false) {
        pcVar12 = "const ";
      }
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      pcVar11 = pcVar12 + 6;
      if ((bool)bVar15 == false) {
        pcVar11 = pcVar12;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,pcVar12,pcVar11);
      iVar16 = 1;
      if (CVar1 == CASESHADERTYPE_VERTEX) {
        iVar16 = 0xc;
      }
      if (optimized) {
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)local_1a8);
        _Var14._M_p = local_1a8[0]._M_dataplus._M_p;
        local_4e8.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
        local_4e8._M_dataplus._M_p = (pointer)paVar4;
        memcpy(paVar4,
               "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
               ,0xa5);
        local_4e8._M_string_length = (size_type)_Var14._M_p;
        paVar4->_M_local_buf[(long)_Var14._M_p] = '\0';
        bVar15 = 0;
        bVar3 = 0;
      }
      else {
        if ((bool)bVar15 == false) {
          std::operator+(&local_4a8,"\t",&local_588);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a8);
        }
        else {
          std::operator+(&local_4a8,"\tconst ",&local_588);
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a8);
        }
        local_4c8 = &local_4b8;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_4b8 = *plVar5;
          uStack_4b0 = puVar6[3];
        }
        else {
          local_4b8 = *plVar5;
          local_4c8 = (long *)*puVar6;
        }
        local_4c0 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        bVar3 = bVar15 ^ 1;
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_4c8,0,(char *)0x0,0xb520aa);
        local_428 = &local_418;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_418 = *plVar9;
          lStack_410 = plVar5[3];
        }
        else {
          local_418 = *plVar9;
          local_428 = (long *)*plVar5;
        }
        local_420 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_428);
        local_408 = &local_3f8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_3f8 = *plVar9;
          lStack_3f0 = plVar5[3];
        }
        else {
          local_3f8 = *plVar9;
          local_408 = (long *)*plVar5;
        }
        local_400 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_408,(ulong)local_5a8._M_dataplus._M_p);
        local_3e8 = &local_3d8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_3d8 = *plVar9;
          lStack_3d0 = plVar5[3];
        }
        else {
          local_3d8 = *plVar9;
          local_3e8 = (long *)*plVar5;
        }
        local_3e0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3e8,(ulong)local_588._M_dataplus._M_p);
        local_3c8 = &local_3b8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_3b8 = *plVar9;
          lStack_3b0 = plVar5[3];
        }
        else {
          local_3b8 = *plVar9;
          local_3c8 = (long *)*plVar5;
        }
        local_3c0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        local_3a8 = &local_398;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_398 = *plVar9;
          lStack_390 = plVar5[3];
        }
        else {
          local_398 = *plVar9;
          local_3a8 = (long *)*plVar5;
        }
        local_3a0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_3a8,(ulong)local_5a8._M_dataplus._M_p);
        local_388 = &local_378;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_378 = *plVar9;
          lStack_370 = plVar5[3];
        }
        else {
          local_378 = *plVar9;
          local_388 = (long *)*plVar5;
        }
        local_380 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_388,(ulong)local_588._M_dataplus._M_p);
        local_368 = &local_358;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_358 = *plVar9;
          lStack_350 = plVar5[3];
        }
        else {
          local_358 = *plVar9;
          local_368 = (long *)*plVar5;
        }
        local_360 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_368);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_558 = *puVar8;
          lStack_550 = plVar5[3];
          local_568 = &local_558;
        }
        else {
          local_558 = *puVar8;
          local_568 = (ulong *)*plVar5;
        }
        local_560 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::operator+(&local_288,"\t",&local_5a8);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_288,(ulong)local_588._M_dataplus._M_p);
        local_468 = &local_458;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_458 = *plVar5;
          lStack_450 = puVar6[3];
        }
        else {
          local_458 = *plVar5;
          local_468 = (long *)*puVar6;
        }
        local_460 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_468);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        psVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_448.field_2._M_allocated_capacity = *psVar10;
          local_448.field_2._8_8_ = puVar6[3];
        }
        else {
          local_448.field_2._M_allocated_capacity = *psVar10;
          local_448._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_448._M_string_length = puVar6[1];
        *puVar6 = psVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        local_308._M_string_length = 0;
        local_308.field_2._M_allocated_capacity =
             local_308.field_2._M_allocated_capacity & 0xffffffffffffff00;
        repeatIndexedTemplate(&local_488,&local_448,iVar16,&local_308,1);
        uVar13 = 0xf;
        if (local_568 != &local_558) {
          uVar13 = local_558;
        }
        if (uVar13 < local_488._M_string_length + local_560) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_488._M_dataplus._M_p != &local_488.field_2) {
            uVar7 = local_488.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_488._M_string_length + local_560) goto LAB_006d4bd1;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_488,0,(char *)0x0,(ulong)local_568);
        }
        else {
LAB_006d4bd1:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_568,(ulong)local_488._M_dataplus._M_p);
        }
        local_548 = &local_538;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_538 = *plVar5;
          uStack_530 = puVar6[3];
        }
        else {
          local_538 = *plVar5;
          local_548 = (long *)*puVar6;
        }
        local_540 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_548);
        local_348 = &local_338;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_338 = *plVar9;
          lStack_330 = plVar5[3];
        }
        else {
          local_338 = *plVar9;
          local_348 = (long *)*plVar5;
        }
        local_340 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_348,(ulong)local_5a8._M_dataplus._M_p);
        local_328 = &local_318;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_318 = *plVar9;
          lStack_310 = plVar5[3];
        }
        else {
          local_318 = *plVar9;
          local_328 = (long *)*plVar5;
        }
        local_320 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_328,(ulong)local_588._M_dataplus._M_p);
        local_2c8 = &local_2b8;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_2b8 = *plVar9;
          lStack_2b0 = plVar5[3];
        }
        else {
          local_2b8 = *plVar9;
          local_2c8 = (long *)*plVar5;
        }
        local_2c0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c8);
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_4f8 = *puVar8;
          lStack_4f0 = plVar5[3];
          local_508 = &local_4f8;
        }
        else {
          local_4f8 = *puVar8;
          local_508 = (ulong *)*plVar5;
        }
        local_500 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,iVar16);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar13 = 0xf;
        if (local_508 != &local_4f8) {
          uVar13 = local_4f8;
        }
        if (uVar13 < local_2e8._M_string_length + local_500) {
          uVar7 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            uVar7 = local_2e8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar7 < local_2e8._M_string_length + local_500) goto LAB_006d533d;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_508);
        }
        else {
LAB_006d533d:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_508,(ulong)local_2e8._M_dataplus._M_p);
        }
        local_528 = &local_518;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          local_518 = *plVar5;
          uStack_510 = puVar6[3];
        }
        else {
          local_518 = *plVar5;
          local_528 = (long *)*puVar6;
        }
        local_520 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)plVar5 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_528);
        local_2a8 = &local_298;
        plVar9 = plVar5 + 2;
        if ((long *)*plVar5 == plVar9) {
          local_298 = *plVar9;
          lStack_290 = plVar5[3];
        }
        else {
          local_298 = *plVar9;
          local_2a8 = (long *)*plVar5;
        }
        local_2a0 = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_2a8);
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        plVar9 = plVar5 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar9) {
          local_4e8.field_2._M_allocated_capacity = *plVar9;
          local_4e8.field_2._8_8_ = plVar5[3];
        }
        else {
          local_4e8.field_2._M_allocated_capacity = *plVar9;
          local_4e8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_4e8._M_string_length = plVar5[1];
        *plVar5 = (long)plVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
      }
      if (!optimized) {
        if (local_2a8 != &local_298) {
          operator_delete(local_2a8,local_298 + 1);
        }
        if (local_528 != &local_518) {
          operator_delete(local_528,local_518 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8 + 1);
        }
        if (local_2c8 != &local_2b8) {
          operator_delete(local_2c8,local_2b8 + 1);
        }
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318 + 1);
        }
        if (local_348 != &local_338) {
          operator_delete(local_348,local_338 + 1);
        }
        if (local_548 != &local_538) {
          operator_delete(local_548,local_538 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_488._M_dataplus._M_p != &local_488.field_2) {
          operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
        }
        if (local_468 != &local_458) {
          operator_delete(local_468,local_458 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if (local_568 != &local_558) {
          operator_delete(local_568,local_558 + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_388 != &local_378) {
          operator_delete(local_388,local_378 + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_3e8 != &local_3d8) {
          operator_delete(local_3e8,local_3d8 + 1);
        }
        if (local_408 != &local_3f8) {
          operator_delete(local_408,local_3f8 + 1);
        }
        if (local_428 != &local_418) {
          operator_delete(local_428,local_418 + 1);
        }
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8,local_4b8 + 1);
        }
      }
      if ((bVar3 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2)) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      if ((bVar15 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_dataplus._M_p != &local_4a8.field_2)) {
        operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_006d66aa;
    }
    if (CVar2 != CASETYPE_BUILT_IN_FUNCTIONS) goto LAB_006d6775;
    pcVar12 = "";
    if (this->m_useConstantExpressionsOnly != false) {
      pcVar12 = "const ";
    }
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    pcVar11 = pcVar12 + 6;
    if (this->m_useConstantExpressionsOnly == false) {
      pcVar11 = pcVar12;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,pcVar12,pcVar11);
    iVar16 = 1;
    if (CVar1 == CASESHADERTYPE_VERTEX) {
      iVar16 = 0xc;
    }
    if (optimized) {
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)0xa5;
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)std::__cxx11::string::_M_create((ulong *)&local_4e8,(ulong)local_1a8);
      _Var14._M_p = local_1a8[0]._M_dataplus._M_p;
      local_4e8.field_2._M_allocated_capacity = (size_type)local_1a8[0]._M_dataplus._M_p;
      local_4e8._M_dataplus._M_p = (pointer)paVar4;
      memcpy(paVar4,
             "\tvalue = vec4(0.4, 0.5, 0.6, 0.7) * value; // NOTE: factor doesn\'t necessarily match the one in unoptimized shader, but shouldn\'t make a difference performance-wise\n"
             ,0xa5);
      local_4e8._M_string_length = (size_type)_Var14._M_p;
      paVar4->_M_local_buf[(long)_Var14._M_p] = '\0';
    }
    else {
      std::operator+(&local_288,"\t",&local_5a8);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_288,(ulong)local_588._M_dataplus._M_p);
      local_468 = &local_458;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_458 = *plVar9;
        lStack_450 = plVar5[3];
      }
      else {
        local_458 = *plVar9;
        local_468 = (long *)*plVar5;
      }
      local_460 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_468);
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_448.field_2._M_allocated_capacity = *psVar10;
        local_448.field_2._8_8_ = plVar5[3];
      }
      else {
        local_448.field_2._M_allocated_capacity = *psVar10;
        local_448._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_448._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_448,(ulong)local_5a8._M_dataplus._M_p);
      local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_488.field_2._M_allocated_capacity = *puVar8;
        local_488.field_2._8_8_ = plVar5[3];
      }
      else {
        local_488.field_2._M_allocated_capacity = *puVar8;
        local_488._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_488._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_488,(ulong)local_588._M_dataplus._M_p);
      local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
      psVar10 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_4a8.field_2._M_allocated_capacity = *psVar10;
        local_4a8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_4a8.field_2._M_allocated_capacity = *psVar10;
        local_4a8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_4a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_4a8);
      local_4c8 = &local_4b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_4b8 = *plVar5;
        uStack_4b0 = puVar6[3];
      }
      else {
        local_4b8 = *plVar5;
        local_4c8 = (long *)*puVar6;
      }
      local_4c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_4c8,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_428 = &local_418;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_418 = *plVar5;
        lStack_410 = puVar6[3];
      }
      else {
        local_418 = *plVar5;
        local_428 = (long *)*puVar6;
      }
      local_420 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_428);
      local_408 = &local_3f8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3f8 = *plVar5;
        lStack_3f0 = puVar6[3];
      }
      else {
        local_3f8 = *plVar5;
        local_408 = (long *)*puVar6;
      }
      local_400 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_408,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_3e8 = &local_3d8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3d8 = *plVar5;
        lStack_3d0 = puVar6[3];
      }
      else {
        local_3d8 = *plVar5;
        local_3e8 = (long *)*puVar6;
      }
      local_3e0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_588._M_dataplus._M_p)
      ;
      local_3c8 = &local_3b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_3b8 = *plVar5;
        lStack_3b0 = puVar6[3];
      }
      else {
        local_3b8 = *plVar5;
        local_3c8 = (long *)*puVar6;
      }
      local_3c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
      local_3a8 = &local_398;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_398 = *plVar5;
        lStack_390 = puVar6[3];
      }
      else {
        local_398 = *plVar5;
        local_3a8 = (long *)*puVar6;
      }
      local_3a0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_388 = &local_378;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_378 = *plVar5;
        lStack_370 = puVar6[3];
      }
      else {
        local_378 = *plVar5;
        local_388 = (long *)*puVar6;
      }
      local_380 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_588._M_dataplus._M_p)
      ;
      local_368 = &local_358;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_358 = *plVar5;
        lStack_350 = puVar6[3];
      }
      else {
        local_358 = *plVar5;
        local_368 = (long *)*puVar6;
      }
      local_360 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_368);
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_558 = *puVar8;
        lStack_550 = puVar6[3];
        local_568 = &local_558;
      }
      else {
        local_558 = *puVar8;
        local_568 = (ulong *)*puVar6;
      }
      local_560 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::operator+(&local_208,"\t",&local_5a8);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_208,(ulong)local_588._M_dataplus._M_p);
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_268.field_2._M_allocated_capacity = *puVar8;
        local_268.field_2._8_8_ = plVar5[3];
      }
      else {
        local_268.field_2._M_allocated_capacity = *puVar8;
        local_268._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_268._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_268);
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_2e8.field_2._M_allocated_capacity = *puVar8;
        local_2e8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *puVar8;
        local_2e8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2e8._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      local_228._M_string_length = 0;
      local_228.field_2._M_allocated_capacity =
           local_228.field_2._M_allocated_capacity & 0xffffffffffffff00;
      repeatIndexedTemplate(&local_308,&local_2e8,iVar16,&local_228,1);
      uVar13 = 0xf;
      if (local_568 != &local_558) {
        uVar13 = local_558;
      }
      if (uVar13 < local_308._M_string_length + local_560) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          uVar7 = local_308.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_308._M_string_length + local_560) goto LAB_006d4f78;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,(ulong)local_568);
      }
      else {
LAB_006d4f78:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_568,(ulong)local_308._M_dataplus._M_p);
      }
      local_548 = &local_538;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_538 = *plVar5;
        uStack_530 = puVar6[3];
      }
      else {
        local_538 = *plVar5;
        local_548 = (long *)*puVar6;
      }
      local_540 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
      local_348 = &local_338;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_338 = *plVar5;
        lStack_330 = puVar6[3];
      }
      else {
        local_338 = *plVar5;
        local_348 = (long *)*puVar6;
      }
      local_340 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_348,(ulong)local_5a8._M_dataplus._M_p)
      ;
      local_328 = &local_318;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_318 = *plVar5;
        lStack_310 = puVar6[3];
      }
      else {
        local_318 = *plVar5;
        local_328 = (long *)*puVar6;
      }
      local_320 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_588._M_dataplus._M_p)
      ;
      local_2c8 = &local_2b8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_2b8 = *plVar5;
        lStack_2b0 = puVar6[3];
      }
      else {
        local_2b8 = *plVar5;
        local_2c8 = (long *)*puVar6;
      }
      local_2c0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      puVar8 = puVar6 + 2;
      if ((ulong *)*puVar6 == puVar8) {
        local_4f8 = *puVar8;
        lStack_4f0 = puVar6[3];
        local_508 = &local_4f8;
      }
      else {
        local_4f8 = *puVar8;
        local_508 = (ulong *)*puVar6;
      }
      local_500 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar16);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar13 = 0xf;
      if (local_508 != &local_4f8) {
        uVar13 = local_4f8;
      }
      if (uVar13 < local_248._M_string_length + local_500) {
        uVar7 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          uVar7 = local_248.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar7 < local_248._M_string_length + local_500) goto LAB_006d55ef;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_508);
      }
      else {
LAB_006d55ef:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_508,(ulong)local_248._M_dataplus._M_p);
      }
      local_528 = &local_518;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_518 = *plVar5;
        uStack_510 = puVar6[3];
      }
      else {
        local_518 = *plVar5;
        local_528 = (long *)*puVar6;
      }
      local_520 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_528);
      local_2a8 = &local_298;
      plVar9 = plVar5 + 2;
      if ((long *)*plVar5 == plVar9) {
        local_298 = *plVar9;
        lStack_290 = plVar5[3];
      }
      else {
        local_298 = *plVar9;
        local_2a8 = (long *)*plVar5;
      }
      local_2a0 = plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2a8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      plVar5 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar5) {
        local_4e8.field_2._M_allocated_capacity = *plVar5;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *plVar5;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
    }
    if (optimized) goto LAB_006d66aa;
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    if (local_528 != &local_518) {
      operator_delete(local_528,local_518 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_508 != &local_4f8) {
      operator_delete(local_508,local_4f8 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_348 != &local_338) {
      operator_delete(local_348,local_338 + 1);
    }
    if (local_548 != &local_538) {
      operator_delete(local_548,local_538 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if (local_568 != &local_558) {
      operator_delete(local_568,local_558 + 1);
    }
    if (local_368 != &local_358) {
      operator_delete(local_368,local_358 + 1);
    }
    if (local_388 != &local_378) {
      operator_delete(local_388,local_378 + 1);
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,local_398 + 1);
    }
    if (local_3c8 != &local_3b8) {
      operator_delete(local_3c8,local_3b8 + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,local_3d8 + 1);
    }
    if (local_408 != &local_3f8) {
      operator_delete(local_408,local_3f8 + 1);
    }
    if (local_428 != &local_418) {
      operator_delete(local_428,local_418 + 1);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,local_4b8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
      operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
    }
    if (local_468 != &local_458) {
      operator_delete(local_468,local_458 + 1);
    }
    uVar7 = local_288.field_2._M_allocated_capacity;
    _Var14._M_p = local_288._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p == &local_288.field_2) goto LAB_006d66aa;
  }
  operator_delete(_Var14._M_p,uVar7 + 1);
LAB_006d66aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,(ulong)(local_4e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._M_dataplus._M_p != &local_588.field_2) {
    operator_delete(local_588._M_dataplus._M_p,
                    CONCAT26(local_588.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_588.field_2._M_local_buf[5],
                                      CONCAT14(local_588.field_2._M_local_buf[4],
                                               local_588.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const bool		isVertexCase	= m_caseShaderType == CASESHADERTYPE_VERTEX;
		const string	precision		= getShaderPrecision(m_caseShaderType);
		const string	statements		= m_caseType == CASETYPE_BUILT_IN_FUNCTIONS		? builtinFunctionsCaseStatements	(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_ARRAY					? arrayCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: m_caseType == CASETYPE_STRUCT					? structCaseStatements				(optimized, m_useConstantExpressionsOnly, precision, isVertexCase)
										: DE_NULL;

		return defaultProgramData(m_caseShaderType, statements);
	}